

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O1

TPM_RC TPMU_ATTEST_Unmarshal(TPMU_ATTEST *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  TPM_RC TVar1;
  
  switch(selector) {
  case 0x8014:
    TVar1 = TPMS_NV_CERTIFY_INFO_Unmarshal(&target->nv,buffer,size);
    return TVar1;
  case 0x8015:
    TVar1 = TPMS_COMMAND_AUDIT_INFO_Unmarshal(&target->commandAudit,buffer,size);
    return TVar1;
  case 0x8016:
    TVar1 = TPMS_SESSION_AUDIT_INFO_Unmarshal(&target->sessionAudit,buffer,size);
    return TVar1;
  case 0x8017:
    TVar1 = TPMS_CERTIFY_INFO_Unmarshal(&target->certify,buffer,size);
    return TVar1;
  case 0x8018:
    TVar1 = TPMS_QUOTE_INFO_Unmarshal(&target->quote,buffer,size);
    return TVar1;
  case 0x8019:
    TVar1 = TPMS_TIME_ATTEST_INFO_Unmarshal(&target->time,buffer,size);
    return TVar1;
  case 0x801a:
    TVar1 = TPMS_CREATION_INFO_Unmarshal(&target->creation,buffer,size);
    return TVar1;
  default:
    return 0x98;
  }
}

Assistant:

TPM_RC
TPMU_ATTEST_Unmarshal(TPMU_ATTEST *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
        case TPM_ST_ATTEST_CERTIFY:
            return TPMS_CERTIFY_INFO_Unmarshal((TPMS_CERTIFY_INFO *)&(target->certify), buffer, size);
        case TPM_ST_ATTEST_CREATION:
            return TPMS_CREATION_INFO_Unmarshal((TPMS_CREATION_INFO *)&(target->creation), buffer, size);
        case TPM_ST_ATTEST_QUOTE:
            return TPMS_QUOTE_INFO_Unmarshal((TPMS_QUOTE_INFO *)&(target->quote), buffer, size);
        case TPM_ST_ATTEST_COMMAND_AUDIT:
            return TPMS_COMMAND_AUDIT_INFO_Unmarshal((TPMS_COMMAND_AUDIT_INFO *)&(target->commandAudit), buffer, size);
        case TPM_ST_ATTEST_SESSION_AUDIT:
            return TPMS_SESSION_AUDIT_INFO_Unmarshal((TPMS_SESSION_AUDIT_INFO *)&(target->sessionAudit), buffer, size);
        case TPM_ST_ATTEST_TIME:
            return TPMS_TIME_ATTEST_INFO_Unmarshal((TPMS_TIME_ATTEST_INFO *)&(target->time), buffer, size);
        case TPM_ST_ATTEST_NV:
            return TPMS_NV_CERTIFY_INFO_Unmarshal((TPMS_NV_CERTIFY_INFO *)&(target->nv), buffer, size);
    }
    return TPM_RC_SELECTOR;
}